

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  double dVar2;
  char *pcVar3;
  ulong uVar4;
  double value;
  int length;
  int K;
  int local_4c;
  double local_48;
  int local_34;
  
  local_48 = d;
  Prefix(this,kNumberType);
  dVar2 = local_48;
  uVar4 = (ulong)local_48 & 0x7ff0000000000000;
  if (uVar4 != 0x7ff0000000000000) {
    this_00 = &this->os_->stack_;
    if (this_00->stackEnd_ < this_00->stackTop_ + 0x19) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x19);
    }
    value = local_48;
    pcVar1 = this_00->stackTop_;
    this_00->stackTop_ = pcVar1 + 0x19;
    if ((local_48 != 0.0) || (NAN(local_48))) {
      local_48 = (double)CONCAT44(local_48._4_4_,this->maxDecimalPlaces_);
      pcVar3 = pcVar1;
      if (value < 0.0) {
        *pcVar1 = '-';
        value = -value;
        pcVar3 = pcVar1 + 1;
      }
      internal::Grisu2(value,pcVar3,&local_4c,&local_34);
      pcVar3 = internal::Prettify(pcVar3,local_4c,local_34,local_48._0_4_);
    }
    else {
      pcVar3 = pcVar1;
      if ((long)dVar2 < 0) {
        pcVar3 = pcVar1 + 1;
        *pcVar1 = '-';
      }
      pcVar3[0] = '0';
      pcVar3[1] = '.';
      pcVar3[2] = '0';
      pcVar3 = pcVar3 + 3;
    }
    (this->os_->stack_).stackTop_ =
         pcVar3 + (long)((this->os_->stack_).stackTop_ + (-0x19 - (long)pcVar1));
  }
  return uVar4 != 0x7ff0000000000000;
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return EndValue(WriteDouble(d)); }